

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-feeder-c-impl.h
# Opt level: O0

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedConBounds<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLW2_NLFeeder_C_Impl>>::ConBndWriter>
          (NLW2_NLFeeder_C_Impl *this,ConBndWriter *crw)

{
  NLW2_NLFeeder_C *pNVar1;
  NLW2_NLFeeder_C_Impl *in_RDI;
  function<void_(NLW2_AlgConRange_C_*)> crw_c;
  anon_class_8_1_ba1d3d48 *__f;
  function<void_(NLW2_AlgConRange_C_*)> *in_stack_ffffffffffffffb0;
  _func_void_void_ptr_void_ptr *p_Var2;
  anon_class_8_1_ba1d3d48 local_30 [6];
  
  __f = local_30;
  std::function<void(NLW2_AlgConRange_C*)>::
  function<mp::NLW2_NLFeeder_C_Impl::FeedConBounds<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLW2_NLFeeder_C_Impl>>::ConBndWriter>(mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLW2_NLFeeder_C_Impl>>::ConBndWriter&)::_lambda(NLW2_AlgConRange_C*)_1_,void>
            (in_stack_ffffffffffffffb0,__f);
  pNVar1 = NLF(in_RDI);
  p_Var2 = pNVar1->FeedConBounds;
  pNVar1 = NLF(in_RDI);
  (*p_Var2)(pNVar1->p_user_data_,__f);
  std::function<void_(NLW2_AlgConRange_C_*)>::~function
            ((function<void_(NLW2_AlgConRange_C_*)> *)0x11f5c1);
  return;
}

Assistant:

void FeedConBounds(ConBoundsWriter& crw) {
    assert(NLF().FeedConBounds);
    std::function<void(NLW2_AlgConRange_C* )> crw_c
        = [&crw](NLW2_AlgConRange_C* bnd_c){
      AlgConRange bnd;
      bnd.k = bnd_c->k;
      bnd.cvar = bnd_c->cvar;
      bnd.L = bnd_c->L;
      bnd.U = bnd_c->U;
      crw.WriteAlgConRange(bnd);
    };
    NLF().FeedConBounds(NLF().p_user_data_, &crw_c);
  }